

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

void * rw::xbox::createTexture(int32 width,int32 height,int32 numlevels,uint32 format)

{
  uint32 uVar1;
  uint32 uVar2;
  int32 *piVar3;
  uint uVar4;
  ulong uVar5;
  int32 *piVar6;
  int32 *piVar7;
  long lVar8;
  uint32 height_00;
  uint32 uVar9;
  int iVar10;
  
  uVar5 = 0;
  uVar2 = width;
  height_00 = height;
  iVar10 = numlevels;
  if (0 < numlevels) {
    do {
      uVar1 = calculateTextureSize(uVar2,height_00,format,(uint32)uVar5);
      uVar4 = (uint32)uVar5 + uVar1;
      uVar5 = (ulong)uVar4;
      uVar1 = (int)uVar2 / 2;
      if (uVar2 + 1 < 3) {
        uVar1 = 1;
      }
      uVar9 = (int)height_00 / 2;
      if (height_00 + 1 < 3) {
        uVar9 = 1;
      }
      iVar10 = iVar10 + -1;
      uVar2 = uVar1;
      height_00 = uVar9;
    } while (iVar10 != 0);
    uVar5 = (ulong)(int)(uVar4 + 3 & 0xfffffffc);
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp line: 504"
  ;
  piVar3 = (int32 *)(*DAT_00149da8)(uVar5 + (long)(numlevels + -1) * 0x18 + 0x20,0x30b00);
  *piVar3 = numlevels;
  piVar3[1] = format;
  if (0 < numlevels) {
    piVar7 = piVar3 + (long)(numlevels + -1) * 6 + 8;
    lVar8 = 0;
    piVar6 = piVar3;
    do {
      *(int32 *)((long)piVar3 + lVar8 + 8) = width;
      *(int32 *)((long)piVar3 + lVar8 + 0xc) = height;
      *(int32 **)((long)piVar3 + lVar8 + 0x18) = piVar7;
      uVar2 = calculateTextureSize(width,height,format,(uint32)piVar6);
      piVar7 = (int32 *)((long)piVar7 + (long)(int)uVar2);
      uVar4 = width + 1;
      piVar6 = (int32 *)0x1;
      width = width / 2;
      if (uVar4 < 3) {
        width = 1;
      }
      *(uint32 *)((long)piVar3 + lVar8 + 0x10) = uVar2;
      uVar4 = height + 1;
      height = height / 2;
      if (uVar4 < 3) {
        height = 1;
      }
      lVar8 = lVar8 + 0x18;
    } while ((ulong)(uint)numlevels * 0x18 != lVar8);
  }
  return piVar3;
}

Assistant:

static void*
createTexture(int32 width, int32 height, int32 numlevels, uint32 format)
{
	int32 w = width;
	int32 h = height;
	int32 size = 0;
	for(int32 i = 0; i < numlevels; i++){
		size += calculateTextureSize(w, h, 1, format);
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	size = (size+3)&~3;
	uint8 *data = (uint8*)rwNew(sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1)+size,
		MEMDUR_EVENT | ID_DRIVER);
	RasterLevels *levels = (RasterLevels*)data;
	data += sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1);
	levels->numlevels = numlevels;
	levels->format = format;
	w = width;
	h = height;
	for(int32 i = 0; i < numlevels; i++){
		levels->levels[i].width = w;
		levels->levels[i].height = h;
		levels->levels[i].data = data;
		levels->levels[i].size = calculateTextureSize(w, h, 1, format);
		data += levels->levels[i].size;
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	return levels;
}